

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

void __thiscall
Units_compareDimensionallyNonEquivalentUnitsWhichHaveSameBase_Test::
~Units_compareDimensionallyNonEquivalentUnitsWhichHaveSameBase_Test
          (Units_compareDimensionallyNonEquivalentUnitsWhichHaveSameBase_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, compareDimensionallyNonEquivalentUnitsWhichHaveSameBase)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u1");
    u1->addUnit(libcellml::Units::StandardUnit::LUX, "milli");

    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("u2");
    u2->addUnit(libcellml::Units::StandardUnit::LUX, 0, 1.0, 1.0);

    EXPECT_FALSE(libcellml::Units::equivalent(u1, u2));
    EXPECT_FALSE(libcellml::Units::equivalent(u2, u1));
}